

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

int Abc_NtkDarBmc(Abc_Ntk_t *pNtk,int nStart,int nFrames,int nSizeMax,int nNodeDelta,int nTimeOut,
                 int nBTLimit,int nBTLimitAll,int fRewrite,int fNewAlgo,int fOrDecomp,int nCofFanLit
                 ,int fVerbose,int *piFrames)

{
  Abc_Cex_t *pAVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Aig_Man_t *pAig;
  long lVar5;
  long lVar6;
  Abc_Ntk_t *pAVar7;
  Abc_Cex_t *pAVar8;
  Aig_Man_t *pAVar9;
  long lVar10;
  Vec_Int_t *vMap;
  timespec ts;
  int iFrame;
  int local_3c;
  int local_38;
  int local_34;
  
  vMap = (Vec_Int_t *)0x0;
  local_3c = nStart;
  local_38 = nNodeDelta;
  local_34 = nSizeMax;
  iVar2 = clock_gettime(3,(timespec *)&ts);
  if (iVar2 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (nTimeOut == 0) {
    lVar10 = 0;
  }
  else {
    iVar2 = clock_gettime(3,(timespec *)&ts);
    if (iVar2 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar10 = lVar10 + (long)nTimeOut * 1000000;
  }
  if (fOrDecomp == 0) {
    pAVar7 = pNtk;
    pAig = Abc_NtkToDar(pNtk,0,1);
    iVar2 = (int)pAVar7;
  }
  else {
    pAVar7 = pNtk;
    pAig = Abc_NtkToDarBmc(pNtk,&vMap);
    iVar2 = (int)pAVar7;
  }
  if (pAig == (Aig_Man_t *)0x0) {
    Abc_Print(iVar2,"Converting miter into AIG has failed.\n");
    return -1;
  }
  if (pAig->nRegs < 1) {
    __assert_fail("pMan->nRegs > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x8e6,
                  "int Abc_NtkDarBmc(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int, int, int, int *)"
                 );
  }
  if ((vMap != (Vec_Int_t *)0x0) && (vMap->nSize != pAig->nTruePos)) {
    __assert_fail("vMap == NULL || Vec_IntSize(vMap) == Saig_ManPoNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x8e7,
                  "int Abc_NtkDarBmc(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int, int, int, int *)"
                 );
  }
  if ((vMap != (Vec_Int_t *)0x0 && fVerbose != 0) && (pNtk->vPos->nSize != pAig->nTruePos)) {
    Abc_Print(iVar2,"Expanded %d outputs into %d outputs using OR decomposition.\n");
  }
  if (fNewAlgo == 0) {
    iVar2 = Saig_BmcPerform(pAig,local_3c,nFrames,local_38,nTimeOut,nBTLimit,nBTLimitAll,fVerbose,0,
                            piFrames,0);
    if (pNtk->pModel != (int *)0x0) {
      free(pNtk->pModel);
      pNtk->pModel = (int *)0x0;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      free(pNtk->pSeqModel);
      pNtk->pSeqModel = (Abc_Cex_t *)0x0;
    }
    pNtk->pSeqModel = pAig->pSeqModel;
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
    goto LAB_0024b6d0;
  }
  iVar2 = Saig_ManBmcSimple(pAig,nFrames,local_34,nBTLimit,fRewrite,fVerbose,&iFrame,nCofFanLit);
  if (piFrames != (int *)0x0) {
    *piFrames = iFrame;
  }
  if (pNtk->pModel != (int *)0x0) {
    free(pNtk->pModel);
    pNtk->pModel = (int *)0x0;
  }
  pAVar8 = pNtk->pSeqModel;
  if (pAVar8 != (Abc_Cex_t *)0x0) {
    free(pAVar8);
    pNtk->pSeqModel = (Abc_Cex_t *)0x0;
  }
  pAVar1 = pAig->pSeqModel;
  pNtk->pSeqModel = pAVar1;
  pAig->pSeqModel = (Abc_Cex_t *)0x0;
  iVar4 = (int)pAVar8;
  if (iVar2 == -1) {
    iVar3 = -1;
    if (-1 < iFrame) {
      iVar3 = iFrame;
    }
    Abc_Print(iVar4,"No output asserted in %d frames. Resource limit reached ",(ulong)(iVar3 + 1));
    if (lVar10 != 0) {
      iVar4 = 3;
      iVar3 = clock_gettime(3,(timespec *)&ts);
      if (iVar3 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      if (lVar10 < lVar6) {
        Abc_Print(iVar4,"(timeout %d sec). ",lVar10);
        goto LAB_0024b658;
      }
    }
    Abc_Print(iVar4,"(conf limit %d). ",(ulong)(uint)nBTLimit);
  }
  else if (iVar2 == 1) {
    Abc_Print(iVar4,"Incorrect return value.  ");
  }
  else {
    Abc_Print(iVar4,"Output %d of miter \"%s\" was asserted in frame %d. ",(ulong)(uint)pAVar1->iPo,
              pNtk->pName,(ulong)(uint)pAVar1->iFrame);
  }
LAB_0024b658:
  Abc_Print(iVar4,"%s =","Time");
  iVar3 = 3;
  iVar4 = clock_gettime(3,(timespec *)&ts);
  if (iVar4 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar3,"%9.2f sec\n",(double)(lVar10 + lVar5) / 1000000.0);
LAB_0024b6d0:
  if ((pNtk->pSeqModel != (Abc_Cex_t *)0x0) &&
     (pAVar9 = pAig, iVar4 = Saig_ManVerifyCex(pAig,pNtk->pSeqModel), iVar4 == 0)) {
    Abc_Print((int)pAVar9,"Abc_NtkDarBmc(): Counter-example verification has FAILED.\n");
  }
  Aig_ManStop(pAig);
  pAVar8 = pNtk->pSeqModel;
  if (vMap != (Vec_Int_t *)0x0 && pAVar8 != (Abc_Cex_t *)0x0) {
    iVar4 = pAVar8->iPo;
    if (((long)iVar4 < 0) || (vMap->nSize <= iVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar8->iPo = vMap->pArray[iVar4];
  }
  if (vMap != (Vec_Int_t *)0x0) {
    if (vMap->pArray != (int *)0x0) {
      free(vMap->pArray);
      vMap->pArray = (int *)0x0;
    }
    if (vMap != (Vec_Int_t *)0x0) {
      free(vMap);
    }
  }
  return iVar2;
}

Assistant:

int Abc_NtkDarBmc( Abc_Ntk_t * pNtk, int nStart, int nFrames, int nSizeMax, int nNodeDelta, int nTimeOut, int nBTLimit, int nBTLimitAll, int fRewrite, int fNewAlgo, int fOrDecomp, int nCofFanLit, int fVerbose, int * piFrames )
{
    Aig_Man_t * pMan;
    Vec_Int_t * vMap = NULL;
    int status, RetValue = -1;
    abctime clk = Abc_Clock();
    abctime nTimeLimit = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    // derive the AIG manager
    if ( fOrDecomp )
        pMan = Abc_NtkToDarBmc( pNtk, &vMap );
    else
        pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
    {
        Abc_Print( 1, "Converting miter into AIG has failed.\n" );
        return RetValue;
    }
    assert( pMan->nRegs > 0 );
    assert( vMap == NULL || Vec_IntSize(vMap) == Saig_ManPoNum(pMan) );
    if ( fVerbose && vMap && Abc_NtkPoNum(pNtk) != Saig_ManPoNum(pMan) ) 
        Abc_Print( 1, "Expanded %d outputs into %d outputs using OR decomposition.\n", Abc_NtkPoNum(pNtk), Saig_ManPoNum(pMan) );

    // perform verification
    if ( fNewAlgo ) // command 'bmc'
    {
        int iFrame;
        RetValue = Saig_ManBmcSimple( pMan, nFrames, nSizeMax, nBTLimit, fRewrite, fVerbose, &iFrame, nCofFanLit );
        if ( piFrames )
            *piFrames = iFrame;
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
        if ( RetValue == 1 )
            Abc_Print( 1, "Incorrect return value.  " );
        else if ( RetValue == -1 )
        {
            Abc_Print( 1, "No output asserted in %d frames. Resource limit reached ", Abc_MaxInt(iFrame+1,0) );
            if ( nTimeLimit && Abc_Clock() > nTimeLimit )
                Abc_Print( 1, "(timeout %d sec). ", nTimeLimit );
            else
                Abc_Print( 1, "(conf limit %d). ", nBTLimit );
        }
        else // if ( RetValue == 0 )
        {
            Abc_Cex_t * pCex = pNtk->pSeqModel;
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", pCex->iPo, pNtk->pName, pCex->iFrame );
        }
ABC_PRT( "Time", Abc_Clock() - clk );
    }
    else
    { 
        RetValue = Saig_BmcPerform( pMan, nStart, nFrames, nNodeDelta, nTimeOut, nBTLimit, nBTLimitAll, fVerbose, 0, piFrames, 0 );
        ABC_FREE( pNtk->pModel );
        ABC_FREE( pNtk->pSeqModel );
        pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    }
    // verify counter-example
    if ( pNtk->pSeqModel ) 
    {
        status = Saig_ManVerifyCex( pMan, pNtk->pSeqModel );
        if ( status == 0 )
            Abc_Print( 1, "Abc_NtkDarBmc(): Counter-example verification has FAILED.\n" );
    }
    Aig_ManStop( pMan );
    // update the counter-example
    if ( pNtk->pSeqModel && vMap )
        pNtk->pSeqModel->iPo = Vec_IntEntry( vMap, pNtk->pSeqModel->iPo );
    Vec_IntFreeP( &vMap );
    return RetValue;
}